

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

shared_ptr<kratos::InterfaceRef> __thiscall
kratos::Generator::interface
          (Generator *this,shared_ptr<kratos::IDefinition> *def,string *interface_name,bool is_port)

{
  initializer_list<const_kratos::IRNode_*> __l;
  reference name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  byte bVar1;
  bool bVar2;
  VarException *this_01;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *this_02;
  UserException *this_03;
  element_type *peVar3;
  element_type *peVar4;
  bool *pbVar5;
  Generator *pGVar6;
  element_type *var;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar7;
  __tuple_element_t<1UL,_tuple<unsigned_int,_vector<unsigned_int,_allocator<unsigned_int>_>,_PortDirection,_PortType>_>
  *__args_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_3;
  element_type *port;
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  byte in_R8B;
  Generator *args_1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar8 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_bool>
  pVar9;
  basic_string_view<char> bVar10;
  shared_ptr<kratos::InterfaceRef> sVar11;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  shared_ptr<kratos::IDefinition> *local_5b8;
  Generator *local_5b0;
  undefined1 local_5a8 [8];
  shared_ptr<kratos::InterfacePort> p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> var_name_1;
  type *type;
  type *dir;
  type *size_1;
  type *width_1;
  tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
  *local_530;
  Generator *local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n_1;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_4d8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ports;
  undefined1 local_4c8;
  undefined1 local_4b9;
  shared_ptr<kratos::IDefinition> *local_4b8;
  Generator *local_4b0;
  undefined1 local_4a8 [8];
  shared_ptr<kratos::InterfaceVar> v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> var_name;
  type *size;
  type *width;
  pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *local_448;
  reference local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  byte local_411;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_410;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_3e0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vars;
  string local_3d0;
  undefined1 local_3a9;
  string local_3a8;
  _Self local_388;
  _Self local_380;
  undefined1 local_372;
  allocator<const_kratos::IRNode_*> local_371;
  element_type *local_370;
  element_type **local_368;
  size_type local_360;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_358;
  string local_330;
  _Self local_310;
  _Self local_308;
  byte local_2f9;
  key_type *pkStack_2f8;
  bool is_port_local;
  string *interface_name_local;
  shared_ptr<kratos::IDefinition> *def_local;
  Generator *this_local;
  shared_ptr<kratos::InterfaceRef> *ref;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_2d0;
  basic_string_view<char> local_2c8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_2b8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_2a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  char *local_298;
  string *local_290;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_288;
  basic_string_view<char> local_278;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_268;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_240;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  string *local_230;
  char *local_228;
  string *local_220;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_218;
  basic_string_view<char> local_208;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1d0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  key_type *local_1c0;
  char *local_1b8;
  string *local_1b0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_1a8;
  basic_string_view<char> local_198;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_160;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_4;
  string *local_150;
  char *local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_140;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_138;
  basic_string_view<char> local_128;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_3;
  string *local_e8;
  char *local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_d8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_d0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_c8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_c0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_b8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_b0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_a0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_98;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_90;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_88;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_80;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_70;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_68;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  pkStack_2f8 = (key_type *)CONCAT71(in_register_00000009,is_port);
  local_2f9 = in_R8B & 1;
  args_1 = this;
  interface_name_local = interface_name;
  def_local = def;
  this_local = this;
  local_308._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
               *)(def + 0x10),pkStack_2f8);
  local_310._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
              *)(def + 0x10));
  bVar2 = std::operator!=(&local_308,&local_310);
  if (bVar2) {
    local_372 = 1;
    this_01 = (VarException *)__cxa_allocate_exception(0x10);
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&def[9].super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
    local_1b0 = &local_330;
    local_1b8 = "{0} already exists in {1}";
    local_1c0 = pkStack_2f8;
    fmt::v7::make_args_checked<std::__cxx11::string_const&,std::__cxx11::string&,char[26],char>
              (&local_1f8,(v7 *)0x43188e,(char (*) [26])pkStack_2f8,
               (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs,
               (remove_reference_t<std::__cxx11::basic_string<char>_&> *)args_1);
    local_1d0 = &local_1f8;
    local_208 = fmt::v7::to_string_view<char,_0>(local_1b8);
    local_a0 = &local_218;
    local_a8 = local_1d0;
    local_70 = local_1d0;
    local_60 = local_1d0;
    local_68 = local_a0;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_a0,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_1d0);
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_218.field_1.values_;
    format_str.size_ = local_218.desc_;
    format_str.data_ = (char *)local_208.size_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_330,(detail *)local_208.data_,format_str,args);
    this_02 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
               ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                     *)(def + 0x10),pkStack_2f8)->
               super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
    local_370 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get(this_02);
    local_368 = &local_370;
    local_360 = 1;
    std::allocator<const_kratos::IRNode_*>::allocator(&local_371);
    __l._M_len = local_360;
    __l._M_array = (iterator)local_368;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_358,__l,&local_371);
    VarException::VarException(this_01,&local_330,&local_358);
    local_372 = 0;
    __cxa_throw(this_01,&VarException::typeinfo,VarException::~VarException);
  }
  local_380._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
               *)&def[0x48].super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,pkStack_2f8);
  local_388._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
              *)&def[0x48].super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
  bVar2 = std::operator!=(&local_380,&local_388);
  if (!bVar2) {
    bVar2 = is_valid_variable_name(pkStack_2f8);
    if (!bVar2) {
      vars._7_1_ = 1;
      auVar8 = __cxa_allocate_exception(0x10);
      local_290 = &local_3d0;
      local_298 = "{0} is a SystemVerilog keyword";
      vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)pkStack_2f8;
      local_2b8.named_args.data =
           (named_arg_info<char> *)
           fmt::v7::make_args_checked<std::__cxx11::string_const&,char[31],char>
                     ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)"{0} is a SystemVerilog keyword",(v7 *)pkStack_2f8,auVar8._8_8_,
                      (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                      "{0} is a SystemVerilog keyword");
      local_2a8 = &local_2b8;
      local_2c8 = fmt::v7::to_string_view<char,_0>(local_298);
      local_c8 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)&ref;
      local_d0 = local_2a8;
      local_c0 = local_2a8;
      local_b0 = local_2a8;
      local_b8 = local_c8;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_c8,0xd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)&local_2a8->string);
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_2d0.values_;
      format_str_01.size_ = (size_t)ref;
      format_str_01.data_ = (char *)local_2c8.size_;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_3d0,(detail *)local_2c8.data_,format_str_01,args_01);
      UserException::UserException(auVar8._0_8_,&local_3d0);
      vars._7_1_ = 0;
      __cxa_throw(auVar8._0_8_,&UserException::typeinfo,UserException::~UserException);
    }
    peVar3 = std::__shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)interface_name_local);
    (*peVar3->_vptr_IDefinition[5])();
    local_411 = 0;
    __range1 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)def;
    local_3e0 = &local_410;
    std::
    make_shared<kratos::InterfaceRef,std::shared_ptr<kratos::IDefinition>const&,kratos::Generator*,std::__cxx11::string_const&>
              ((shared_ptr<kratos::IDefinition> *)this,(Generator **)interface_name_local,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1);
    bVar1 = local_2f9;
    peVar4 = std::
             __shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    pbVar5 = InterfaceRef::is_port(peVar4);
    this_00 = local_3e0;
    *pbVar5 = (bool)(bVar1 & 1);
    __end1 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(local_3e0);
    n = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this_00);
    while( true ) {
      bVar2 = std::operator!=(&__end1,(_Self *)&n);
      if (!bVar2) break;
      local_440 = std::
                  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end1);
      peVar3 = std::
               __shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)interface_name_local);
      (*peVar3->_vptr_IDefinition[3])(&width,peVar3,local_440);
      local_448 = (pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                  &width;
      pGVar6 = (Generator *)
               std::get<0ul,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                         (local_448);
      aVar7.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           std::get<1ul,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                     (local_448);
      local_d8 = &v.super___shared_ptr<kratos::InterfaceVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ;
      local_e0 = "{0}.{1}";
      local_e8 = pkStack_2f8;
      vargs_3 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_440;
      fmt::v7::
      make_args_checked<std::__cxx11::string_const&,std::__cxx11::string_const&,char[8],char>
                (&local_118,(v7 *)0x438f87,(char (*) [8])pkStack_2f8,local_440,
                 (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)args_1);
      local_f8 = &local_118;
      bVar10 = fmt::v7::to_string_view<char,_0>(local_e0);
      local_50 = &local_138;
      local_58 = local_f8;
      local_20 = local_f8;
      local_10 = local_f8;
      local_18 = local_50;
      local_128 = bVar10;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_50,0xdd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_f8);
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_138.field_1.values_;
      format_str_02.size_ = local_138.desc_;
      format_str_02.data_ = (char *)local_128.size_;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)
                 &v.super___shared_ptr<kratos::InterfaceVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,(detail *)local_128.data_,format_str_02,args_02);
      local_4b0 = (Generator *)
                  std::__shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2> *)this)
      ;
      local_4b9 = 0;
      local_4b8 = def;
      std::
      make_shared<kratos::InterfaceVar,kratos::InterfaceRef*,kratos::Generator*,std::__cxx11::string_const&,unsigned_int_const&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,bool>
                ((InterfaceRef **)local_4a8,&local_4b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4b8,
                 (uint *)local_440,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)pGVar6,
                 (bool *)aVar7.values_);
      peVar4 = std::
               __shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      name = local_440;
      var = std::__shared_ptr<kratos::InterfaceVar,_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<kratos::InterfaceVar,_(__gnu_cxx::_Lock_policy)2> *)local_4a8);
      InterfaceRef::var(peVar4,name,&var->super_Var);
      pVar9 = std::
              map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
              ::emplace<std::__cxx11::string&,std::shared_ptr<kratos::InterfaceVar>&>
                        ((map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                          *)(def + 0x10),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &v.super___shared_ptr<kratos::InterfaceVar,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(shared_ptr<kratos::InterfaceVar> *)local_4a8);
      ports = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)pVar9.first._M_node;
      local_4c8 = pVar9.second;
      std::shared_ptr<kratos::InterfaceVar>::~shared_ptr
                ((shared_ptr<kratos::InterfaceVar> *)local_4a8);
      std::__cxx11::string::~string
                ((string *)
                 &v.super___shared_ptr<kratos::InterfaceVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~pair
                ((pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &width);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1);
      args_1 = pGVar6;
      in_R9 = aVar7;
    }
    peVar3 = std::__shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)interface_name_local);
    (*peVar3->_vptr_IDefinition[4])(&__range1_1);
    local_4d8 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1_1;
    __end1_1 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range1_1);
    n_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1_1);
    while( true ) {
      bVar2 = std::operator!=(&__end1_1,(_Self *)&n_1);
      if (!bVar2) break;
      local_528 = (Generator *)
                  std::
                  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end1_1);
      peVar3 = std::
               __shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)interface_name_local);
      (*peVar3->_vptr_IDefinition[2])(&width_1,peVar3,local_528);
      local_530 = (tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
                   *)&width_1;
      aVar7.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           std::
           get<0ul,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,kratos::PortDirection,kratos::PortType>
                     (local_530);
      __args_6 = std::
                 get<1ul,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,kratos::PortDirection,kratos::PortType>
                           (local_530);
      __args_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 get<2ul,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,kratos::PortDirection,kratos::PortType>
                           (local_530);
      pbVar5 = (bool *)std::
                       get<3ul,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,kratos::PortDirection,kratos::PortType>
                                 (local_530);
      local_140 = &p.super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      local_148 = "{0}.{1}";
      local_150 = pkStack_2f8;
      vargs_4 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_528;
      fmt::v7::
      make_args_checked<std::__cxx11::string_const&,std::__cxx11::string_const&,char[8],char>
                (&local_188,(v7 *)0x438f87,(char (*) [8])pkStack_2f8,
                 (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)local_528,
                 (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)args_1);
      local_160 = &local_188;
      bVar10 = fmt::v7::to_string_view<char,_0>(local_148);
      local_40 = &local_1a8;
      local_48 = local_160;
      local_38 = local_160;
      local_28 = local_160;
      local_30 = local_40;
      local_198 = bVar10;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_40,0xdd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_160);
      args_03.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_03.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_1a8.field_1.values_;
      format_str_03.size_ = local_1a8.desc_;
      format_str_03.data_ = (char *)local_198.size_;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)
                 &p.super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(detail *)local_198.data_,format_str_03,args_03);
      local_5b0 = (Generator *)
                  std::__shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2> *)this)
      ;
      args_1 = local_528;
      local_5b8 = def;
      std::
      make_shared<kratos::InterfacePort,kratos::InterfaceRef*,kratos::Generator*,kratos::PortDirection_const&,std::__cxx11::string_const&,unsigned_int_const&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,kratos::PortType_const&,bool>
                ((InterfaceRef **)local_5a8,&local_5b0,(PortDirection *)&local_5b8,__args_3,
                 (uint *)local_528,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)aVar7.values_,
                 (PortType *)__args_6,pbVar5);
      peVar4 = std::
               __shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      pGVar6 = local_528;
      port = std::__shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2> *)local_5a8
                       );
      InterfaceRef::port(peVar4,(string *)pGVar6,&port->super_Port);
      in_R9 = aVar7;
      if ((local_2f9 & 1) != 0) {
        (*(code *)(def->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [7]._vptr_IDefinition)
                  (def,&p.super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
        in_R9 = aVar7;
      }
      std::
      map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
      ::emplace<std::__cxx11::string&,std::shared_ptr<kratos::InterfacePort>&>
                ((map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                  *)(def + 0x10),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &p.super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(shared_ptr<kratos::InterfacePort> *)local_5a8);
      std::shared_ptr<kratos::InterfacePort>::~shared_ptr
                ((shared_ptr<kratos::InterfacePort> *)local_5a8);
      std::__cxx11::string::~string
                ((string *)
                 &p.super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::
      tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
      ::~tuple((tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
                *)&width_1);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1_1);
    }
    std::
    map<std::__cxx11::string,std::shared_ptr<kratos::InterfaceRef>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>>>
    ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::InterfaceRef>&>
              ((map<std::__cxx11::string,std::shared_ptr<kratos::InterfaceRef>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>>>
                *)&def[0x48].super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount,pkStack_2f8,(shared_ptr<kratos::InterfaceRef> *)this);
    local_411 = 1;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1_1);
    if ((local_411 & 1) == 0) {
      std::shared_ptr<kratos::InterfaceRef>::~shared_ptr((shared_ptr<kratos::InterfaceRef> *)this);
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set(&local_410);
    sVar11.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar11.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<kratos::InterfaceRef>)
           sVar11.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>;
  }
  local_3a9 = 1;
  this_03 = (UserException *)__cxa_allocate_exception(0x10);
  vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&def[9].super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
  local_220 = &local_3a8;
  local_228 = "{0} already exists in {1}";
  local_230 = pkStack_2f8;
  fmt::v7::make_args_checked<std::__cxx11::string_const&,std::__cxx11::string&,char[26],char>
            (&local_268,(v7 *)0x43188e,(char (*) [26])pkStack_2f8,
             (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs_1,
             (remove_reference_t<std::__cxx11::basic_string<char>_&> *)args_1);
  local_240 = &local_268;
  local_278 = fmt::v7::to_string_view<char,_0>(local_228);
  local_90 = &local_288;
  local_98 = local_240;
  local_88 = local_240;
  local_78 = local_240;
  local_80 = local_90;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_90,0xdd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_240);
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_288.field_1.values_;
  format_str_00.size_ = local_288.desc_;
  format_str_00.data_ = (char *)local_278.size_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_3a8,(detail *)local_278.data_,format_str_00,args_00);
  UserException::UserException(this_03,&local_3a8);
  local_3a9 = 0;
  __cxa_throw(this_03,&UserException::typeinfo,UserException::~UserException);
}

Assistant:

std::shared_ptr<InterfaceRef> Generator::interface(const std::shared_ptr<IDefinition> &def,
                                                   const std::string &interface_name,
                                                   bool is_port) {
    // making sure that it doesn't have ports or vars
    if (vars_.find(interface_name) != vars_.end()) {
        throw VarException(::format("{0} already exists in {1}", interface_name, instance_name),
                           {vars_.at(interface_name).get()});
    }
    if (interfaces_.find(interface_name) != interfaces_.end()) {
        throw UserException(::format("{0} already exists in {1}", interface_name, instance_name));
    }
    // check to see if it's a valid name
    if (!is_valid_variable_name(interface_name)) {
        throw UserException(::format("{0} is a SystemVerilog keyword", interface_name));
    }
    // create vars
    auto const &vars = def->vars();
    auto ref = std::make_shared<InterfaceRef>(def, this, interface_name);
    ref->is_port() = is_port;
    for (auto const &n : vars) {
        auto const &[width, size] = def->var(n);
        // for now they are all unsigned
        auto var_name = ::format("{0}.{1}", interface_name, n);
        auto v = std::make_shared<InterfaceVar>(ref.get(), this, n, width, size, false);
        ref->var(n, v.get());
        vars_.emplace(var_name, v);
    }
    auto const &ports = def->ports();
    for (auto const &n : ports) {
        auto const &[width, size, dir, type] = def->port(n);
        // for now they are all unsigned
        auto var_name = ::format("{0}.{1}", interface_name, n);
        auto p = std::make_shared<InterfacePort>(ref.get(), this, dir, n, width, size, type, false);
        ref->port(n, p.get());
        if (is_port) add_port_name(var_name);
        vars_.emplace(var_name, p);
    }
    // put it in the interface
    interfaces_.emplace(interface_name, ref);
    return ref;
}